

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
emplaceValue<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (Node<unsigned_long_long,_QSslServerPrivate::SocketData> *this,Connection *args,
          Connection *args_1,shared_ptr<QTimer> *args_2)

{
  Connection *in_RCX;
  SocketData *in_RDX;
  Connection *in_RSI;
  SocketData *in_RDI;
  long in_FS_OFFSET;
  SocketData *this_00;
  shared_ptr<QTimer> *timer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<QTimer> local_38;
  SocketData local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &local_38.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QMetaObject::Connection::Connection((Connection *)this_01,in_RSI);
  timer = &local_38;
  QMetaObject::Connection::Connection((Connection *)timer,&in_RDX->readyReadConnection);
  this_00 = &local_28;
  QSslServerPrivate::SocketData::SocketData(in_RDX,in_RCX,(Connection *)this_01,timer);
  QSslServerPrivate::SocketData::operator=(this_00,in_RDI);
  QSslServerPrivate::SocketData::~SocketData(this_00);
  QMetaObject::Connection::~Connection((Connection *)timer);
  QMetaObject::Connection::~Connection((Connection *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }